

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

ParseResult * toml::parseFile(ParseResult *__return_storage_ptr__,string *filename)

{
  long *plVar1;
  size_type *psVar2;
  ifstream ifs;
  Value local_278;
  long *local_268 [2];
  long local_258 [2];
  string local_248;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    parse(__return_storage_ptr__,(istream *)local_228);
  }
  else {
    local_278.type_ = NULL_TYPE;
    local_278.field_1.null_ = (void *)0x0;
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"could not open file: ","");
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_268,(ulong)(filename->_M_dataplus)._M_p);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_248.field_2._M_allocated_capacity = *psVar2;
      local_248.field_2._8_8_ = plVar1[3];
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar2;
      local_248._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_248._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ParseResult::ParseResult(__return_storage_ptr__,&local_278,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_268[0] != local_258) {
      operator_delete(local_268[0],local_258[0] + 1);
    }
    Value::~Value(&local_278);
  }
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult parseFile(const std::string& filename)
{
    std::ifstream ifs(filename);
    if (!ifs) {
        return ParseResult(toml::Value(),
                           std::string("could not open file: ") + filename);
    }

    return parse(ifs);
}